

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

int main(void)

{
  Header *pHVar1;
  ostream *poVar2;
  MCU *mcus_00;
  string local_f0;
  byte local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string outFileName;
  size_t pos;
  MCU *mcus;
  string local_70;
  Header *local_50;
  Header *header;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string filename;
  
  filename.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/Cheemion[P]JPEG_COMPRESS/resource/lina.jpg"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string((string *)&local_70,(string *)local_30);
  pHVar1 = readJPG(&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_50 = pHVar1;
  if (pHVar1 == (Header *)0x0) {
    filename.field_2._12_4_ = 0xffffffff;
  }
  else if ((pHVar1->valid & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pHVar1 = local_50;
    if (local_50 != (Header *)0x0) {
      Header::~Header(local_50);
      operator_delete(pHVar1,0x1e70);
    }
    filename.field_2._12_4_ = 0xffffffff;
  }
  else {
    printHeader(pHVar1);
    mcus_00 = decodeHuffmanData(local_50);
    pHVar1 = local_50;
    if (mcus_00 == (MCU *)0x0) {
      if (local_50 != (Header *)0x0) {
        Header::~Header(local_50);
        operator_delete(pHVar1,0x1e70);
      }
      filename.field_2._12_4_ = 0;
    }
    else {
      dequantize(local_50,mcus_00);
      inverseDCT(local_50,mcus_00);
      YCbCrToRGB(local_50,mcus_00);
      poVar2 = std::operator<<((ostream *)&std::cout,"done");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      outFileName.field_2._8_8_ = std::__cxx11::string::find_last_of((char)local_30,0x2e);
      local_c9 = 0;
      if (outFileName.field_2._8_8_ == -1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_30,".");
      }
      else {
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)local_30);
        local_c9 = 1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                       ,&local_c8,".bmp");
      }
      if ((local_c9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_c8);
      }
      pHVar1 = local_50;
      std::__cxx11::string::string((string *)&local_f0,(string *)local_a8);
      writeBMP(pHVar1,mcus_00,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      if (mcus_00 != (MCU *)0x0) {
        operator_delete__(mcus_00);
      }
      pHVar1 = local_50;
      if (local_50 != (Header *)0x0) {
        Header::~Header(local_50);
        operator_delete(pHVar1,0x1e70);
      }
      filename.field_2._12_4_ = 0;
      std::__cxx11::string::~string((string *)local_a8);
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return filename.field_2._12_4_;
}

Assistant:

int main() {
	
	//jpeg file path
	const std::string filename(EXAMPLE_PATH_JPG);

	Header* header = readJPG(filename);
	if (header == nullptr) {
		return -1;
	}

	if (header->valid == false) {
		std::cout << "Error" << std::endl;
		delete header;
		return -1;
	}

	printHeader(header);


	//decode huffman data
	MCU* mcus = decodeHuffmanData(header);
	//write BMP file
	if (mcus == nullptr)
	{	
		delete header;
		return 0;
	}

	dequantize(header, mcus);

	inverseDCT(header, mcus);

	YCbCrToRGB(header, mcus);

	std::cout << "done" << std::endl;
	// write BMP file
	const std::size_t pos = filename.find_last_of('.');
	const std::string outFileName = (pos == std::string::npos) ? (filename + ".") : (filename.substr(0, pos) + ".bmp");
	writeBMP(header, mcus, outFileName);
	delete[] mcus;
	delete header;

	return 0;
}